

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace_geodesic.cpp
# Opt level: O2

TraceSubResult *
geometrycentral::surface::anon_unknown_2::traceInFaceBarycentric
          (TraceSubResult *__return_storage_ptr__,IntrinsicGeometryInterface *geom,Face face,
          Vector3 startPoint,Vector3 vecBary,Vector2 vecCartesianDir,double vecCartesianLen,
          array<bool,_3UL> edgeIsHittable,TraceOptions *traceOptions)

{
  char cVar1;
  undefined8 uVar2;
  bool bVar3;
  size_t i;
  ParentMeshT *pPVar4;
  _List_node_base *p_Var5;
  long lVar6;
  runtime_error *this;
  ulong uVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  IntrinsicGeometryInterface *geom_00;
  size_t extraout_RDX;
  long lVar11;
  code *pcVar12;
  long lVar13;
  undefined *puVar14;
  ulong uVar15;
  undefined5 in_register_00000083;
  ulong uVar16;
  ParentMeshT *pPVar17;
  IntrinsicGeometryInterface *this_00;
  double dVar19;
  undefined1 auVar21 [16];
  undefined1 auVar22 [64];
  undefined1 auVar23 [16];
  double dVar24;
  Halfedge he;
  Vector2 VVar25;
  Face face_00;
  array<bool,_3UL> edgeIsHittable_local;
  Vector2 vecCartesianDir_local;
  double local_b8 [4];
  double local_98;
  undefined8 uStack_90;
  Vector2 local_88;
  Vector2 local_70;
  array<geometrycentral::Vector2,_3UL> vertexCoords;
  double dVar18;
  double dVar20;
  
  face_00.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.mesh
       = (ParentMeshT *)
         face.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.
         ind;
  geom_00 = (IntrinsicGeometryInterface *)
            face.
            super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.
            mesh;
  vecCartesianDir_local.y = vecCartesianDir.y;
  vecCartesianDir_local.x = vecCartesianDir.x;
  edgeIsHittable_local._M_elems._0_2_ = edgeIsHittable._M_elems._0_2_;
  face_00.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.ind =
       CONCAT53(in_register_00000083,edgeIsHittable._M_elems) >> 0x10 & 0xffff;
  edgeIsHittable_local._M_elems[2] =
       SUB81(face_00.
             super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.
             ind,0);
  vertexCoordinatesInTriangle(&vertexCoords,(anon_unknown_2 *)geom,geom_00,face_00);
  pPVar4 = (ParentMeshT *)
           (&((geom_00->super_BaseGeometryInterface).faceIndices.deleteCallbackIt._M_node)->_M_next)
           [(long)face_00.
                  super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
                  .mesh];
  if ((startPoint.x + startPoint.y + startPoint.z < 0.5) && (traceOptions->errorOnProblem == true))
  {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error(this,"bad bary point");
LAB_00194b95:
    puVar14 = &::std::runtime_error::typeinfo;
    pcVar12 = ::std::runtime_error::~runtime_error;
LAB_00194ba3:
    __cxa_throw(this,puVar14,pcVar12);
  }
  auVar23._0_8_ = startPoint.x + vecBary.x;
  auVar23._8_8_ = startPoint.y + vecBary.y;
  if (((0.0 <= auVar23._0_8_) && (auVar21 = vshufpd_avx(auVar23,auVar23,1), 0.0 <= auVar21._0_8_))
     && (dVar24 = startPoint.z + vecBary.z, 0.0 <= dVar24)) {
    TraceSubResult::TraceSubResult(__return_storage_ptr__);
    __return_storage_ptr__->terminated = true;
    (__return_storage_ptr__->endPoint).type = Face;
    (__return_storage_ptr__->endPoint).vertex.
    super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.mesh =
         (ParentMeshT *)0x0;
    (__return_storage_ptr__->endPoint).vertex.
    super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind =
         0xffffffffffffffff;
    (__return_storage_ptr__->endPoint).edge.
    super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.mesh =
         (ParentMeshT *)0x0;
    (__return_storage_ptr__->endPoint).edge.
    super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind =
         0xffffffffffffffff;
    (__return_storage_ptr__->endPoint).tEdge = NAN;
    (__return_storage_ptr__->endPoint).face.
    super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.mesh =
         (ParentMeshT *)geom_00;
    (__return_storage_ptr__->endPoint).face.
    super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.ind =
         (size_t)face_00.
                 super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
                 .mesh;
    (__return_storage_ptr__->endPoint).faceCoords.x = auVar23._0_8_;
    (__return_storage_ptr__->endPoint).faceCoords.y = auVar23._8_8_;
    (__return_storage_ptr__->endPoint).faceCoords.z = dVar24;
LAB_001949b2:
    (__return_storage_ptr__->incomingDirToPoint).x = vecCartesianDir_local.x;
    (__return_storage_ptr__->incomingDirToPoint).y = vecCartesianDir_local.y;
    return __return_storage_ptr__;
  }
  auVar22 = ZEXT1664(ZEXT816(0x7ff0000000000000));
  uVar7 = 0xfffffcf7;
  uVar15 = 0;
  pPVar17 = (ParentMeshT *)0xffffffffffffffff;
  this_00 = (IntrinsicGeometryInterface *)0x0;
  while (uVar15 != 3) {
    pPVar4 = *(ParentMeshT **)
              ((geom_00->super_BaseGeometryInterface).cornerIndices.defaultValue + (long)pPVar4 * 8)
    ;
    uVar16 = 0;
    if (uVar15 != 2) {
      uVar16 = (ulong)((int)uVar15 + 1);
    }
    if (((edgeIsHittable_local._M_elems[uVar16] == false) || (0.0 <= (&vecBary.x)[uVar15])) ||
       (dVar24 = -(&startPoint.x)[uVar15] / (&vecBary.x)[uVar15], auVar22._0_8_ <= dVar24)) {
      uVar15 = uVar15 + 1;
    }
    else {
      uVar7 = uVar15 & 0xffffffff;
      uVar15 = uVar15 + 1;
      auVar22 = ZEXT1664(CONCAT88(0x8000000000000000,dVar24));
      pPVar17 = pPVar4;
      this_00 = geom_00;
    }
  }
  if (pPVar17 == (ParentMeshT *)0xffffffffffffffff) {
    if (traceOptions->errorOnProblem != true) {
      TraceSubResult::TraceSubResult(__return_storage_ptr__);
      __return_storage_ptr__->terminated = true;
      (__return_storage_ptr__->endPoint).faceCoords.z = startPoint.z;
      (__return_storage_ptr__->endPoint).faceCoords.x = startPoint.x;
      (__return_storage_ptr__->endPoint).faceCoords.y = startPoint.y;
      (__return_storage_ptr__->endPoint).type = Face;
      (__return_storage_ptr__->endPoint).vertex.
      super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.mesh =
           (ParentMeshT *)0x0;
      (__return_storage_ptr__->endPoint).vertex.
      super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind =
           0xffffffffffffffff;
      (__return_storage_ptr__->endPoint).edge.
      super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.mesh =
           (ParentMeshT *)0x0;
      (__return_storage_ptr__->endPoint).edge.
      super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind =
           0xffffffffffffffff;
      (__return_storage_ptr__->endPoint).tEdge = NAN;
      (__return_storage_ptr__->endPoint).face.
      super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.mesh =
           (ParentMeshT *)geom_00;
      (__return_storage_ptr__->endPoint).face.
      super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.ind =
           (size_t)face_00.
                   super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
                   .mesh;
      goto LAB_001949b2;
    }
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::logic_error::logic_error
              ((logic_error *)this,"no halfedge intersection was selected, precondition problem?");
    puVar14 = &::std::logic_error::typeinfo;
    pcVar12 = ::std::logic_error::~logic_error;
    goto LAB_00194ba3;
  }
  auVar23 = vmaxsd_avx(ZEXT816(0) << 0x40,auVar22._0_16_);
  uVar2 = vcmpsd_avx512f(ZEXT816(0x3fefffffff768fa1),auVar22._0_16_,1);
  bVar3 = (bool)((byte)uVar2 & 1);
  local_98 = (double)((ulong)bVar3 * 0x3fefffffff768fa1 + (ulong)!bVar3 * auVar23._0_8_);
  uStack_90 = auVar23._8_8_;
  local_b8[0] = startPoint.x + vecBary.x * local_98;
  local_b8[1] = startPoint.y + vecBary.y * local_98;
  local_b8[2] = startPoint.z + vecBary.z * local_98;
  iVar9 = ((int)uVar7 + 2) % 3;
  dVar24 = local_b8[iVar9];
  iVar10 = ((int)uVar7 + 1) % 3;
  dVar19 = local_b8[iVar10];
  local_88 = (Vector2)vsubpd_avx((undefined1  [16])vertexCoords._M_elems[iVar9],
                                 (undefined1  [16])vertexCoords._M_elems[iVar10]);
  local_70 = Vector2::normalize(&local_88);
  VVar25 = Vector2::operator/(&vecCartesianDir_local,&local_70);
  dVar20 = VVar25.y;
  dVar18 = VVar25.x;
  if ((0x7fefffffffffffff < (ulong)ABS(dVar18) || 0x7fefffffffffffff < (ulong)ABS(dVar20)) &&
     (traceOptions->errorOnProblem == true)) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error
              (this,"bad value transforming to new edge. is there a zero-length edge?");
    goto LAB_00194b95;
  }
  cVar1 = *(char *)&(this_00->super_BaseGeometryInterface).boundaryLoopIndices.data.
                    super_PlainObjectBase<Eigen::Matrix<unsigned_long,__1,_1,_0,__1,_1>_>.m_storage.
                    m_data;
  auVar21._0_8_ = dVar24 / (dVar24 + dVar19);
  auVar21._8_8_ = 0;
  auVar23 = vmaxsd_avx(ZEXT816(0),auVar21);
  uVar2 = vcmpsd_avx512f(ZEXT816(0x3ff0000000000000),auVar21,1);
  bVar3 = (bool)((byte)uVar2 & 1);
  dVar24 = (double)((ulong)bVar3 * 0x3ff0000000000000 + (ulong)!bVar3 * auVar23._0_8_);
  if (cVar1 == '\x01') {
    uVar7 = (ulong)pPVar17 ^ 1;
  }
  else {
    uVar7 = *(ulong *)((this_00->super_BaseGeometryInterface).boundaryLoopIndices.data.
                       super_PlainObjectBase<Eigen::Matrix<unsigned_long,__1,_1,_0,__1,_1>_>.
                       m_storage.m_rows + (long)pPVar17 * 8);
  }
  if ((&((this_00->super_BaseGeometryInterface).faceIndices.mesh)->_vptr_SurfaceMesh)[uVar7] <
      (this_00->super_BaseGeometryInterface).cornerIndicesQ.super_DependentQuantity.evaluateFunc.
      _M_invoker) {
    if (traceOptions->barrierEdges != (EdgeData<bool> *)0x0) {
      if (cVar1 == '\0') {
        p_Var5 = (&((this_00->super_BaseGeometryInterface).boundaryLoopIndices.deleteCallbackIt.
                   _M_node)->_M_next)[(long)pPVar17];
      }
      else {
        p_Var5 = (_List_node_base *)((ulong)pPVar17 >> 1);
      }
      if (*(bool *)((long)&p_Var5->_M_next +
                   (long)(traceOptions->barrierEdges->data).
                         super_PlainObjectBase<Eigen::Matrix<bool,__1,_1,_0,__1,_1>_>.m_storage.
                         m_data) == true) goto LAB_00194a20;
    }
    dVar19 = 1.0 - local_98;
    TraceSubResult::TraceSubResult(__return_storage_ptr__);
    __return_storage_ptr__->terminated = false;
    (__return_storage_ptr__->crossHe).
    super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.mesh =
         (ParentMeshT *)this_00;
    (__return_storage_ptr__->crossHe).
    super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.ind =
         (size_t)pPVar17;
    lVar6 = 0x30;
    lVar8 = 0x28;
    lVar11 = 0x20;
    lVar13 = 0x18;
    VVar25.y = dVar19 * vecCartesianLen;
    VVar25.x = dVar20;
  }
  else {
LAB_00194a20:
    TraceSubResult::TraceSubResult(__return_storage_ptr__);
    __return_storage_ptr__->terminated = true;
    if (*(char *)&(this_00->super_BaseGeometryInterface).boundaryLoopIndices.data.
                  super_PlainObjectBase<Eigen::Matrix<unsigned_long,__1,_1,_0,__1,_1>_>.m_storage.
                  m_data == '\x01') {
      p_Var5 = (_List_node_base *)((ulong)pPVar17 >> 1);
    }
    else {
      p_Var5 = (&((this_00->super_BaseGeometryInterface).boundaryLoopIndices.deleteCallbackIt.
                 _M_node)->_M_next)[(long)pPVar17];
    }
    he.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.ind
         = extraout_RDX;
    he.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.mesh
         = pPVar17;
    dVar19 = convertTToEdge((anon_unknown_2 *)this_00,he,dVar24);
    dVar18 = NAN;
    dVar24 = NAN;
    (__return_storage_ptr__->endPoint).type = Edge;
    (__return_storage_ptr__->endPoint).vertex.
    super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.mesh =
         (ParentMeshT *)0x0;
    (__return_storage_ptr__->endPoint).vertex.
    super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind =
         0xffffffffffffffff;
    (__return_storage_ptr__->endPoint).edge.
    super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.mesh =
         (ParentMeshT *)this_00;
    (__return_storage_ptr__->endPoint).edge.
    super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind =
         (size_t)p_Var5;
    (__return_storage_ptr__->endPoint).tEdge = dVar19;
    (__return_storage_ptr__->endPoint).face.
    super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.mesh =
         (ParentMeshT *)0x0;
    (__return_storage_ptr__->endPoint).face.
    super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.ind =
         0xffffffffffffffff;
    lVar8 = 0x90;
    lVar11 = 0x88;
    lVar13 = 0x80;
    (__return_storage_ptr__->endPoint).faceCoords.x = NAN;
    lVar6 = 0x98;
  }
  *(double *)(&__return_storage_ptr__->terminated + lVar13) = dVar24;
  *(double *)(&__return_storage_ptr__->terminated + lVar11) = dVar18;
  *(double *)(&__return_storage_ptr__->terminated + lVar8) = VVar25.x;
  *(double *)(&__return_storage_ptr__->terminated + lVar6) = VVar25.y;
  return __return_storage_ptr__;
}

Assistant:

inline TraceSubResult traceInFaceBarycentric(IntrinsicGeometryInterface& geom, Face face, Vector3 startPoint,
                                             Vector3 vecBary, Vector2 vecCartesianDir, double vecCartesianLen,
                                             std::array<bool, 3> edgeIsHittable, const TraceOptions& traceOptions) {

  // Gather values
  std::array<Vector2, 3> vertexCoords = vertexCoordinatesInTriangle(geom, face);
  Vector3 triangleLengths{geom.edgeLengths[face.halfedge().edge()], geom.edgeLengths[face.halfedge().next().edge()],
                          geom.edgeLengths[face.halfedge().next().next().edge()]};

  if (sum(startPoint) < 0.5) {
    if (TRACE_PRINT) {
      cout << "  bad bary point: " << startPoint << endl;
    }
    if (traceOptions.errorOnProblem) {
      throw std::runtime_error("bad bary point");
    }
  }

  if (TRACE_PRINT) {
    cout << "  general trace in face: " << endl;
    cout << "  face: " << face << " startPoint " << startPoint << " vecBary = " << vecBary << " vecCartesian "
         << vecCartesianDir << " " << vecCartesianLen << endl;
  }

  if (TRACE_PRINT) {
    cout << "  vec bary  = " << vecBary << endl;
    cout << "  reconvert = " << cartesianVectorToBarycentric(vertexCoords, vecCartesianDir) * vecCartesianLen << endl;
  }

  // Test if the vector ends in the triangle
  Vector3 endPoint = startPoint + vecBary;
  if (TRACE_PRINT) {
    cout << "    endpoint: " << endPoint << endl;
  }

  /*
  if (isInsideTriangle(endPoint)) {
    // Fancy test if ending on edges
    // (to detect when we're within eps of edge)
    bool foundEpsEdge = false;
    if (traceOptions.allowEndOnEdge) {
      double A = 0.5 * cross(vertexCoords[1] - vertexCoords[0], vertexCoords[2] - vertexCoords[0]);
      Halfedge endHe = face.halfedge();
      for (int i = 0; i < 3; i++) {
        double dist = 2. * endPoint[i] * A / triangleLengths[i]; // perp distance to edge
        if (endPoint[i] > 0 && dist < traceOptions.allowEndOnEdgeEps) {
          // force the process below to hit this edge, let other logic proceed
          edgeIsHittable[i] = true;
          edgeIsHittable[(i + 1) % 3] = false;
          edgeIsHittable[(i + 2) % 3] = false;
          foundEpsEdge = true;
          break;
        }
      }
    }
    // Simple test if not ending on edges
    if (!foundEpsEdge) {
      // The trace ended! Call it a day.
      TraceSubResult result;
      result.terminated = true;
      result.endPoint = SurfacePoint(face, endPoint);
      result.incomingDirToPoint = vecCartesian;
      return result;
    }
  }
  */

  if (isInsideTriangle(endPoint)) {
    // The trace ended! Call it a day.
    TraceSubResult result;
    result.terminated = true;
    result.endPoint = SurfacePoint(face, endPoint);
    result.incomingDirToPoint = vecCartesianDir;
    return result;
  }


  // The vector did not end in this triangle. Pick an appropriate point along some edge
  double tRay = std::numeric_limits<double>::infinity();
  Halfedge crossHe = Halfedge();
  int iOppVertEnd = -777;
  Halfedge currHe = face.halfedge();
  for (int i = 0; i < 3; i++) {
    currHe = currHe.next(); // always opposite the i'th vertex

    // Check the crossing
    double tRayThisRaw = -startPoint[i] / vecBary[i];
    double tRayThis = clamp(tRayThisRaw, 0., 1. - TRACE_EPS_LOOSE);

    if (TRACE_PRINT) {
      cout << "    considering intersection:" << endl;
      cout << std::boolalpha;
      cout << "      hittable[(i+1)%3]: " << edgeIsHittable[(i + 1) % 3] << endl;
      cout << "      vecBary[i]: " << vecBary[i] << endl;
      cout << "      startPoint[i]: " << startPoint[i] << endl;
      cout << "      tRayThisRaw: " << tRayThisRaw << endl;
      cout << "      tRayThis: " << tRayThis << endl;
    }


    if (!edgeIsHittable[(i + 1) % 3] || vecBary[i] >= 0) {
      // note should ALWAYS satisfy precondition that vecBary[i] is negative for at least one hittable edge.
      // if not, fix projection of inputs in caller
      continue;
    }

    if (tRayThisRaw < tRay) {
      // This is the new closest intersection
      tRay = tRayThisRaw;
      crossHe = currHe;
      iOppVertEnd = i;
    }
  }

  if (TRACE_PRINT) {
    cout << "    selected intersection:" << endl;
    cout << "      crossHe: " << crossHe << endl;
    cout << "      tRay: " << tRay << endl;
    cout << "      iOppVertEnd: " << iOppVertEnd << endl;
  }

  // Clamp to a sane range
  tRay = clamp(tRay, 0., 1. - TRACE_EPS_LOOSE);


  if (crossHe == Halfedge()) {
    if (traceOptions.errorOnProblem) {
      throw std::logic_error("no halfedge intersection was selected, precondition problem?");
    }
    if (TRACE_PRINT) {
      cout << "    PROBLEM PROBLEM NO INTERSECTION:" << endl;
    }

    // End immediately
    TraceSubResult result;
    result.terminated = true;
    result.endPoint = SurfacePoint(face, startPoint);
    result.incomingDirToPoint = vecCartesianDir;
    return result;
  }

  // Compute some useful info about the endpoint
  Vector3 endPointOnEdge = startPoint + tRay * vecBary;
  double tCross = endPointOnEdge[(iOppVertEnd + 2) % 3] /
                  (endPointOnEdge[(iOppVertEnd + 1) % 3] + endPointOnEdge[(iOppVertEnd + 2) % 3]);
  if (TRACE_PRINT) {
    cout << "    end point on edge: " << endPointOnEdge << endl;
    cout << "    tCross raw: " << tCross << endl;
  }
  tCross = clamp(tCross, 0., 1.);

  // Rotate the vector in to the frame of crossHe and shorten it
  double lenRemaining = (1.0 - tRay) * vecCartesianLen;
  Vector2 crossingEdgeVec = (vertexCoords[(iOppVertEnd + 2) % 3] - vertexCoords[(iOppVertEnd + 1) % 3]);
  Vector2 remainingDirInHalfedge = vecCartesianDir / crossingEdgeVec.normalize();
  if (!isfinite(remainingDirInHalfedge)) {
    if (TRACE_PRINT) {
      cout << "    NON FINITE REMAINING TRACE" << endl;
      cout << "    lenRemaining = " << lenRemaining << endl;
      cout << "    crossingEdgeVec = " << crossingEdgeVec << endl;
      cout << "    remainingDirInHalfedge = " << remainingDirInHalfedge << endl;
    }

    if (traceOptions.errorOnProblem) {
      throw std::runtime_error("bad value transforming to new edge. is there a zero-length edge?");
    }
  }


  // Stop tracing if we hit a boundary
  if (!crossHe.twin().isInterior() || (traceOptions.barrierEdges && (*traceOptions.barrierEdges)[crossHe.edge()])) {
    // Build the result
    TraceSubResult result;
    result.terminated = true;
    result.endPoint = SurfacePoint(crossHe.edge(), convertTToEdge(crossHe, tCross));
    result.incomingDirToPoint = remainingDirInHalfedge;

    return result;
  }

  // Build the result
  TraceSubResult result;
  result.terminated = false;
  result.crossHe = crossHe;
  result.tCross = tCross;
  result.traceVectorInHalfedgeDir = remainingDirInHalfedge;
  result.traceVectorInHalfedgeLen = lenRemaining;
  return result;
}